

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueBooleanCase::test
          (UniformValueBooleanCase *this)

{
  CallLogWrapper *this_00;
  RenderContext *renderCtx;
  GLint GVar1;
  GLint in_R8D;
  GLint x;
  GLint in_R9D;
  GLint y;
  GLint in_stack_fffffffffffffe00;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  ShaderProgram program;
  ProgramSources local_e8;
  
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,
             "uniform bool boolUniform;\nuniform bvec2 bool2Uniform;\nuniform bvec3 bool3Uniform;\nuniform bvec4 bool4Uniform;\nvoid main (void)\n{\n\tgl_Position = vec4(float(boolUniform) + float(bool2Uniform.x) + float(bool3Uniform.x) + float(bool4Uniform.x));\n}\n"
             ,&local_1f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"void main (void)\n{\n\tgl_FragColor = vec4(0.0);\n}\n",&local_1fa
            );
  glu::makeVtxFragSources(&local_e8,&local_1d8,&local_1f8);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,&local_e8);
  glu::ProgramSources::~ProgramSources(&local_e8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (program.m_program.m_info.linkOk == false) {
    glu::operator<<((this->super_ApiCase).m_log,&program);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  else {
    this_00 = &(this->super_ApiCase).super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_00,program.m_program.m_program);
    ApiCase::expectError(&this->super_ApiCase,0);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"boolUniform");
    glu::CallLogWrapper::glUniform1i(this_00,GVar1,1);
    verifyUniformValue1i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               program.m_program.m_program,GVar1,in_R8D);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"bool2Uniform");
    glu::CallLogWrapper::glUniform2i(this_00,GVar1,1,2);
    verifyUniformValue2i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               program.m_program.m_program,GVar1,1,in_R9D);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"bool3Uniform");
    glu::CallLogWrapper::glUniform3i(this_00,GVar1,0,1,2);
    verifyUniformValue3i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               program.m_program.m_program,GVar1,0,1,1);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"bool4Uniform");
    glu::CallLogWrapper::glUniform4i(this_00,GVar1,1,0,1,-1);
    x = 0;
    y = 1;
    verifyUniformValue4i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               program.m_program.m_program,GVar1,0,1,1,in_stack_fffffffffffffe00);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"boolUniform");
    glu::CallLogWrapper::glUniform1f(this_00,GVar1,1.0);
    verifyUniformValue1i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               program.m_program.m_program,GVar1,x);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"bool2Uniform");
    glu::CallLogWrapper::glUniform2f(this_00,GVar1,1.0,0.1);
    verifyUniformValue2i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               program.m_program.m_program,GVar1,1,y);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"bool3Uniform");
    glu::CallLogWrapper::glUniform3f(this_00,GVar1,0.0,0.1,-0.1);
    verifyUniformValue3i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               program.m_program.m_program,GVar1,0,1,1);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,program.m_program.m_program,"bool4Uniform");
    glu::CallLogWrapper::glUniform4f(this_00,GVar1,1.0,0.0,0.1,-0.9);
    verifyUniformValue4i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               program.m_program.m_program,GVar1,0,1,1,in_stack_fffffffffffffe00);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"uniform bool boolUniform;\n"
			"uniform bvec2 bool2Uniform;\n"
			"uniform bvec3 bool3Uniform;\n"
			"uniform bvec4 bool4Uniform;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(float(boolUniform) + float(bool2Uniform.x) + float(bool3Uniform.x) + float(bool4Uniform.x));\n"
			"}\n";
		static const char* testFragSource =
			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		// int conversion

		location = glGetUniformLocation(program.getProgram(), "boolUniform");
		glUniform1i(location, 1);
		verifyUniformValue1i(m_testCtx, *this, program.getProgram(), location, 1);

		location = glGetUniformLocation(program.getProgram(), "bool2Uniform");
		glUniform2i(location, 1, 2);
		verifyUniformValue2i(m_testCtx, *this, program.getProgram(), location, 1, 1);

		location = glGetUniformLocation(program.getProgram(), "bool3Uniform");
		glUniform3i(location, 0, 1, 2);
		verifyUniformValue3i(m_testCtx, *this, program.getProgram(), location, 0, 1, 1);

		location = glGetUniformLocation(program.getProgram(), "bool4Uniform");
		glUniform4i(location, 1, 0, 1, -1);
		verifyUniformValue4i(m_testCtx, *this, program.getProgram(), location, 1, 0, 1, 1);

		// float conversion

		location = glGetUniformLocation(program.getProgram(), "boolUniform");
		glUniform1f(location, 1.0f);
		verifyUniformValue1i(m_testCtx, *this, program.getProgram(), location, 1);

		location = glGetUniformLocation(program.getProgram(), "bool2Uniform");
		glUniform2f(location, 1.0f, 0.1f);
		verifyUniformValue2i(m_testCtx, *this, program.getProgram(), location, 1, 1);

		location = glGetUniformLocation(program.getProgram(), "bool3Uniform");
		glUniform3f(location, 0.0f, 0.1f, -0.1f);
		verifyUniformValue3i(m_testCtx, *this, program.getProgram(), location, 0, 1, 1);

		location = glGetUniformLocation(program.getProgram(), "bool4Uniform");
		glUniform4f(location, 1.0f, 0.0f, 0.1f, -0.9f);
		verifyUniformValue4i(m_testCtx, *this, program.getProgram(), location, 1, 0, 1, 1);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}